

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

char * change_to_string(int change)

{
  uint uVar1;
  char *pcStack_10;
  int change_local;
  
  uVar1 = change & 3;
  if (uVar1 == 1) {
    pcStack_10 = "add";
  }
  else if (uVar1 == 2) {
    pcStack_10 = "del";
  }
  else if (uVar1 == 0) {
    pcStack_10 = "none";
  }
  else {
    pcStack_10 = "???";
  }
  return pcStack_10;
}

Assistant:

static const char *
change_to_string(int change)
{
	change &= (EV_CHANGE_ADD|EV_CHANGE_DEL);
	if (change == EV_CHANGE_ADD) {
		return "add";
	} else if (change == EV_CHANGE_DEL) {
		return "del";
	} else if (change == 0) {
		return "none";
	} else {
		return "???";
	}
}